

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterFullEndElement(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk_00;
  undefined8 *puVar4;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  lk_00 = xmlListFront(writer->nodes);
  if (lk_00 == (xmlLinkPtr)0x0) {
    return -1;
  }
  puVar4 = (undefined8 *)xmlLinkGetData(lk_00);
  if (puVar4 == (undefined8 *)0x0) {
    return -1;
  }
  lk._0_4_ = 0;
  iVar1 = *(int *)(puVar4 + 1);
  if (iVar1 != 1) {
    if (iVar1 != 2) {
      if (iVar1 != 3) {
        return -1;
      }
      goto LAB_002426ec;
    }
    lk._0_4_ = xmlTextWriterEndAttribute(writer);
    if ((int)lk < 0) {
      return -1;
    }
  }
  iVar1 = xmlTextWriterOutputNSDecl(writer);
  if (iVar1 < 0) {
    return -1;
  }
  iVar2 = xmlOutputBufferWriteString(writer->out,">");
  if (iVar2 < 0) {
    return -1;
  }
  lk._0_4_ = iVar2 + iVar1 + (int)lk;
  if (writer->indent != 0) {
    writer->doindent = 0;
  }
LAB_002426ec:
  if ((writer->indent == 0) || (writer->doindent == 0)) {
    writer->doindent = 1;
  }
  else {
    iVar1 = xmlTextWriterWriteIndent(writer);
    lk._0_4_ = iVar1 + (int)lk;
    writer->doindent = 1;
  }
  iVar1 = xmlOutputBufferWriteString(writer->out,"</");
  if (iVar1 < 0) {
    writer_local._4_4_ = -1;
  }
  else {
    iVar2 = xmlOutputBufferWriteString(writer->out,(char *)*puVar4);
    if (iVar2 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar3 = xmlOutputBufferWriteString(writer->out,">");
      if (iVar3 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        lk._0_4_ = iVar3 + iVar2 + iVar1 + (int)lk;
        if (writer->indent != 0) {
          iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
          lk._0_4_ = iVar1 + (int)lk;
        }
        xmlListPopFront(writer->nodes);
        writer_local._4_4_ = (int)lk;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterFullEndElement(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    lk = xmlListFront(writer->nodes);
    if (lk == 0)
        return -1;

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_ATTRIBUTE:
            count = xmlTextWriterEndAttribute(writer);
            if (count < 0)
                return -1;
            sum += count;
            /* fallthrough */
        case XML_TEXTWRITER_NAME:
            /* Output namespace declarations */
            count = xmlTextWriterOutputNSDecl(writer);
            if (count < 0)
                return -1;
            sum += count;

            count = xmlOutputBufferWriteString(writer->out, ">");
            if (count < 0)
                return -1;
            sum += count;
            if (writer->indent)
                writer->doindent = 0;
            /* fallthrough */
        case XML_TEXTWRITER_TEXT:
            if ((writer->indent) && (writer->doindent)) {
                count = xmlTextWriterWriteIndent(writer);
                sum += count;
                writer->doindent = 1;
            } else
                writer->doindent = 1;
            count = xmlOutputBufferWriteString(writer->out, "</");
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out,
                                               (const char *) p->name);
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, ">");
            if (count < 0)
                return -1;
            sum += count;
            break;
        default:
            return -1;
    }

    if (writer->indent) {
        count = xmlOutputBufferWriteString(writer->out, "\n");
        sum += count;
    }

    xmlListPopFront(writer->nodes);
    return sum;
}